

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void __thiscall
Fixpp::impl::
FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::Int>>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>,Fixpp::TagT<141u,Fixpp::Type::Boolean>,Fixpp::TagT<383u,Fixpp::Type::Int>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<2154u,Fixpp::Type::Int>>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>
           *this,Field *field,ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<2154U,_Fixpp::Type::Int>_>_>_>
          *tagSet,bool strict,bool skipUnknown)

{
  StreamCursor *this_00;
  bool bVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  long lVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  Type type;
  size_t sVar13;
  size_t sVar14;
  size_t count;
  StreamBuf<char> *pSVar15;
  ulong uVar16;
  uint tag;
  int iVar17;
  undefined1 auStack_1f8 [8];
  GroupType groupRef;
  undefined1 auStack_b8 [8];
  GroupSet groupSet;
  char local_78;
  Visitor visitor;
  long lVar7;
  
  this_00 = context->cursor;
  pSVar15 = this_00->buf;
  lVar5 = *(long *)&pSVar15->field_0x10;
  lVar7 = *(long *)&pSVar15->field_0x18;
  if (lVar7 == lVar5) {
    lVar5 = (**(code **)(*(long *)pSVar15 + 0x38))();
    pSVar15 = this_00->buf;
    if (lVar5 != 0) {
      lVar5 = *(long *)&pSVar15->field_0x10;
      lVar7 = *(long *)&pSVar15->field_0x18;
      goto LAB_00987b79;
    }
  }
  else {
LAB_00987b79:
    sVar6 = lVar7 - lVar5;
    if (sVar6 == 0) {
      sVar6 = (**(code **)(*(long *)pSVar15 + 0x38))();
    }
    sVar13 = 0;
    iVar17 = 0;
    do {
      sVar14 = sVar13;
      if (9 < (byte)(*(byte *)(lVar5 + sVar13) - 0x30)) break;
      iVar17 = (uint)*(byte *)(lVar5 + sVar13) + iVar17 * 10 + -0x30;
      sVar13 = sVar13 + 1;
      sVar14 = sVar6;
    } while (sVar6 != sVar13);
    if (sVar14 != 0) {
      StreamCursor::advance(this_00,sVar14);
      bVar1 = StreamCursor::advance(this_00,1);
      if (iVar17 == 0) {
        if (!bVar1) {
          pcVar12 = "Got early EOF after tag %d value";
          goto LAB_00988125;
        }
      }
      else {
        if (!bVar1) {
          pcVar12 = "Expected RepeatingGroup %d, got EOF";
LAB_00988125:
          ParsingContext::setError(context,Incomplete,pcVar12,0x180);
          return;
        }
        if ((ulong)(((long)(field->values).
                           super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                           .
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                           .
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                           .super_SmallVectorBase.CapacityX -
                     (long)(field->values).
                           super_SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>_>
                           .
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                           .
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_void>
                           .super_SmallVectorBase.BeginX >> 3) * 0x6f96f96f96f96f97) <
            (ulong)(long)iVar17) {
          llvm::
          SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
          ::grow((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                  *)field,(long)iVar17);
        }
        groupSet.bits.super__Base_bitset<7UL>._M_w[3] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[4] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[1] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[2] = 0;
        auStack_b8 = (undefined1  [8])0x0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[0] = 0;
        groupSet.bits.super__Base_bitset<7UL>._M_w[5] = 0;
        do {
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
          .values.base.
          super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
          value.m_view.second = 0;
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
          .values.base.
          super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_false>.
          value.m_view.first = (char *)0x0;
          auStack_1f8 = (undefined1  [8])0x0;
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
          .values.base.
          super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<372U,_Fixpp::Type::String>_>,_false>.
          value.m_view.first = (char *)0x0;
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
          ._32_8_ = 0;
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
          .allBits.super__Base_bitset<1UL>._M_w =
               (_Base_bitset<1UL>)
               ((long)&groupRef.
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                       .unparsed.
                       super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                       .
                       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                       .super_SmallVectorBase + 0x10);
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
          .unparsed.
          super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
          .
          super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
          .
          super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
          .super_SmallVectorBase.EndX =
               (void *)((long)groupRef.
                              super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                              .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.
                              buffer + 0x10);
          bVar1 = true;
          groupRef.
          super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
          .unparsed.
          super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
          .
          super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
          .
          super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
          .super_SmallVectorBase.BeginX =
               (void *)groupRef.
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                       .allBits.super__Base_bitset<1UL>._M_w;
          do {
            while( true ) {
              pSVar15 = this_00->buf;
              visitor.strict = (bool)pSVar15->field_0x8;
              visitor.skipUnknown = (bool)pSVar15->field_0x9;
              visitor._26_6_ = *(undefined6 *)&pSVar15->field_0xa;
              lVar5 = *(long *)&pSVar15->field_0x10;
              lVar7 = *(long *)&pSVar15->field_0x18;
              lVar8 = lVar7;
              lVar11 = lVar5;
              bVar2 = bVar1;
              if (lVar7 != lVar5) break;
              lVar8 = (**(code **)(*(long *)pSVar15 + 0x38))();
              pSVar15 = this_00->buf;
              if (lVar8 != 0) {
                lVar8 = *(long *)&pSVar15->field_0x18;
                lVar11 = *(long *)&pSVar15->field_0x10;
                break;
              }
LAB_00987dfc:
              pcVar12 = *(char **)&pSVar15->field_0x10;
              pcVar9 = *(char **)&pSVar15->field_0x18;
              if (pcVar9 == pcVar12) {
                lVar8 = (**(code **)(*(long *)pSVar15 + 0x38))();
                if (lVar8 != 0) {
                  pSVar15 = this_00->buf;
                  pcVar12 = *(char **)&pSVar15->field_0x10;
                  pcVar9 = *(char **)&pSVar15->field_0x18;
                  goto LAB_00987e23;
                }
                cVar3 = '?';
              }
              else {
LAB_00987e23:
                if (pcVar12 < pcVar9) {
                  cVar3 = *pcVar12;
                }
                else {
                  cVar3 = (**(code **)(*(long *)pSVar15 + 0x48))();
                }
              }
              iVar17 = 1;
              ParsingContext::setError
                        (context,ParsingError,
                         "Could not parse tag in RepeatingGroup %d, expected int, got \'%c\'",0x180,
                         (ulong)(uint)(int)cVar3);
LAB_00987e75:
              bVar1 = bVar2;
              pSVar15 = this_00->buf;
              pSVar15->field_0x8 = visitor.strict;
              pSVar15->field_0x9 = visitor.skipUnknown;
              *(undefined6 *)&pSVar15->field_0xa = visitor._26_6_;
              *(long *)&pSVar15->field_0x10 = lVar5;
              *(long *)&pSVar15->field_0x18 = lVar7;
LAB_00987e8b:
              if (iVar17 != 0) {
                if (iVar17 == 10) {
                  llvm::
                  SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                  ::push_back((SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>,_false>
                               *)field,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                                        *)auStack_1f8);
                  groupSet.bits.super__Base_bitset<7UL>._M_w[3] = 0;
                  groupSet.bits.super__Base_bitset<7UL>._M_w[4] = 0;
                  groupSet.bits.super__Base_bitset<7UL>._M_w[1] = 0;
                  groupSet.bits.super__Base_bitset<7UL>._M_w[2] = 0;
                  auStack_b8 = (undefined1  [8])0x0;
                  groupSet.bits.super__Base_bitset<7UL>._M_w[0] = 0;
                  groupSet.bits.super__Base_bitset<7UL>._M_w[5] = 0;
                }
                else {
                  bVar1 = (bool)(iVar17 == 0 & bVar1);
                }
                goto LAB_00988068;
              }
            }
            sVar6 = lVar8 - lVar11;
            if (sVar6 == 0) {
              sVar6 = (**(code **)(*(long *)pSVar15 + 0x38))();
            }
            sVar13 = 0;
            sVar14 = 0;
            do {
              count = sVar13;
              if (9 < (byte)(*(byte *)(lVar11 + sVar13) - 0x30)) break;
              sVar14 = (size_t)(((uint)*(byte *)(lVar11 + sVar13) + (int)sVar14 * 10) - 0x30);
              sVar13 = sVar13 + 1;
              count = sVar6;
            } while (sVar6 != sVar13);
            if (count == 0) {
              pSVar15 = this_00->buf;
              goto LAB_00987dfc;
            }
            StreamCursor::advance(this_00,count);
            lVar8 = 1;
            lVar11 = 0;
            do {
              lVar10 = (lVar11 + lVar8) / 2;
              tag = (uint)sVar14;
              if (details::
                  IndexesImpl<meta::pack::Pack<Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                  ::Sorted.arr[lVar10] == tag) {
                bVar4 = std::bitset<386UL>::test((bitset<386UL> *)auStack_b8,sVar14);
                iVar17 = 10;
                if (bVar4) goto LAB_00987e75;
                bVar2 = StreamCursor::advance(this_00,1);
                if (!bVar2) {
                  pcVar12 = "Expected value after Tag %d, got EOF";
                  goto LAB_00988032;
                }
                TagSet<Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                ::set((TagSet<Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                       *)auStack_b8,tag);
                local_78 = '\0';
                visitor.context = (ParsingContext *)auStack_b8;
                visitor._0_8_ = context;
                visitor.groupSet._0_1_ = strict;
                visitor.groupSet._1_1_ = skipUnknown;
                doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>>>::Visitor,0ul,1ul>
                          (auStack_1f8,sVar14,&stack0xffffffffffffff88);
                iVar17 = 0;
                if ((local_78 == '\0') && (bVar2 = StreamCursor::advance(this_00,1), !bVar2)) {
                  iVar17 = 1;
                  ParsingContext::setError
                            (context,Incomplete,"Got early EOF in RepeatingGroup %d",0x180);
                }
                goto LAB_00987e8b;
              }
              if (details::
                  IndexesImpl<meta::pack::Pack<Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>_>
                  ::Sorted.arr[lVar10] < (int)tag) {
                lVar11 = lVar10 + 1;
              }
              else {
                lVar8 = lVar10 + -1;
              }
            } while (lVar11 <= lVar8);
            lVar8 = 7;
            lVar11 = 0;
            do {
              lVar10 = (lVar11 + lVar8) / 2;
              if (details::
                  IndexesImpl<meta::pack::Pack<Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<2154U,_Fixpp::Type::Int>_>_>_>
                  ::Sorted.arr[lVar10] == tag) goto LAB_00987d6d;
              if (details::
                  IndexesImpl<meta::pack::Pack<Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::Int>_>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>,_Fixpp::TagT<141U,_Fixpp::Type::Boolean>,_Fixpp::TagT<383U,_Fixpp::Type::Int>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<2154U,_Fixpp::Type::Int>_>_>_>
                  ::Sorted.arr[lVar10] < (int)tag) {
                lVar11 = lVar10 + 1;
              }
              else {
                lVar8 = lVar10 + -1;
              }
            } while (lVar11 <= lVar8);
            lVar10 = -1;
LAB_00987d6d:
            iVar17 = 10;
            bVar2 = false;
            if ((lVar10 != -1) || (bVar2 = false, tag == 10)) goto LAB_00987e75;
            bVar2 = StreamCursor::advance(this_00,1);
            if (!bVar2) {
              pcVar12 = "Expected value after tag %d, got EOF";
LAB_00988032:
              bVar1 = false;
              ParsingContext::setError(context,Incomplete,pcVar12,sVar14);
              goto LAB_00988068;
            }
            lVar5 = *(long *)&this_00->buf->field_0x8;
            lVar7 = *(long *)&this_00->buf->field_0x10;
            while( true ) {
              pSVar15 = this_00->buf;
              pcVar12 = *(char **)&pSVar15->field_0x10;
              pcVar9 = *(char **)&pSVar15->field_0x18;
              if (pcVar9 == pcVar12) {
                lVar8 = (**(code **)(*(long *)pSVar15 + 0x38))();
                if (lVar8 == 0) {
                  type = ParsingError;
                  pcVar12 = "Expected value after tag %d, got EOF";
                  goto LAB_00988003;
                }
                pSVar15 = this_00->buf;
                pcVar12 = *(char **)&pSVar15->field_0x10;
                pcVar9 = *(char **)&pSVar15->field_0x18;
              }
              if (pcVar12 < pcVar9) {
                cVar3 = *pcVar12;
              }
              else {
                cVar3 = (**(code **)(*(long *)pSVar15 + 0x48))();
              }
              if (cVar3 == '|') break;
              StreamCursor::advance(this_00,1);
            }
            if (strict) {
              bVar1 = false;
              ParsingContext::setError
                        (context,UnknownTag,"Encountered unknown tag %d in RepeatingGroup %d",sVar14
                         ,0x180);
              goto LAB_00988068;
            }
            if (!skipUnknown) {
              lVar8 = *(long *)&this_00->buf->field_0x10;
              lVar11 = *(long *)&this_00->buf->field_0x8;
              if (groupRef.
                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                  .unparsed.
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                  .
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                  .
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                  .super_SmallVectorBase.EndX <=
                  groupRef.
                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                  .unparsed.
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                  .
                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                  .
                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                  .super_SmallVectorBase.BeginX) {
                llvm::
                SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                        *)&groupRef.
                           super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                           .allBits,0);
              }
              *(uint *)groupRef.
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                       .unparsed.
                       super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                       .
                       super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                       .
                       super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                       .super_SmallVectorBase.BeginX = tag;
              *(long *)((long)groupRef.
                              super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                              .unparsed.
                              super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                              .
                              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                              .
                              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                              .super_SmallVectorBase.BeginX + 8) = lVar7;
              *(long *)((long)groupRef.
                              super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                              .unparsed.
                              super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                              .
                              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                              .
                              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                              .super_SmallVectorBase.BeginX + 0x10) =
                   (lVar5 + lVar8) - (lVar11 + lVar7);
              groupRef.
              super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
              .unparsed.
              super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
              .
              super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
              .
              super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
              .super_SmallVectorBase.BeginX =
                   (void *)((long)groupRef.
                                  super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                                  .unparsed.
                                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                                  .
                                  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                                  .
                                  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                                  .super_SmallVectorBase.BeginX + 0x18);
            }
            bVar2 = StreamCursor::advance(this_00,1);
          } while (bVar2);
          type = Incomplete;
          pcVar12 = "Got early EOF after tag %d value";
LAB_00988003:
          bVar1 = false;
          ParsingContext::setError(context,type,pcVar12,sVar14);
LAB_00988068:
          if (groupRef.
              super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
              .allBits.super__Base_bitset<1UL>._M_w !=
              (_Base_bitset<1UL>)
              ((long)&groupRef.
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                      .unparsed.
                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed>
                      .
                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_false>
                      .
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>::Unparsed,_void>
                      .super_SmallVectorBase + 0x10U)) {
            free((void *)groupRef.
                         super_MessageBase<Fixpp::FieldRef,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>
                         .allBits.super__Base_bitset<1UL>._M_w);
          }
        } while (bVar1);
      }
      return;
    }
    pSVar15 = this_00->buf;
  }
  pcVar12 = *(char **)&pSVar15->field_0x10;
  pcVar9 = *(char **)&pSVar15->field_0x18;
  if (pcVar9 == pcVar12) {
    lVar5 = (**(code **)(*(long *)pSVar15 + 0x38))();
    if (lVar5 == 0) {
      uVar16 = 0x3f;
      goto LAB_009880d2;
    }
    pSVar15 = this_00->buf;
    pcVar12 = *(char **)&pSVar15->field_0x10;
    pcVar9 = *(char **)&pSVar15->field_0x18;
  }
  if (pcVar12 < pcVar9) {
    cVar3 = *pcVar12;
  }
  else {
    cVar3 = (**(code **)(*(long *)pSVar15 + 0x48))();
  }
  uVar16 = (ulong)(uint)(int)cVar3;
LAB_009880d2:
  ParsingContext::setError
            (context,ParsingError,
             "Could not parse instances number in RepeatingGroup %d, expected int, got \'%c\'",0x180
             ,uVar16);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool strict, bool skipUnknown)
            {
                auto& cursor = context.cursor;

                int instances;
                TRY_MATCH_INT(
                    instances,
                    "Could not parse instances number in RepeatingGroup %d, expected int, got '%c'",
                     GroupTag::Id, CURSOR_CURRENT(cursor)
                );

                if (!instances)
                {
                    TRY_ADVANCE("Got early EOF after tag %d value", GroupTag::Id);
                    return;
                }

                // Literal('=')
                TRY_ADVANCE("Expected RepeatingGroup %d, got EOF", GroupTag::Id);

                field.reserve(instances);

                GroupSet groupSet;

                int tag;
                bool inGroup = true;

                do
                {
                    typename Field::GroupType groupRef;

                    for (;;)
                    {

                        StreamCursor::Revert revertTag(cursor);
                        TRY_MATCH_INT(
                            tag,
                            "Could not parse tag in RepeatingGroup %d, expected int, got '%c'",
                            GroupTag::Id, CURSOR_CURRENT(cursor)
                        );

                        // The tag we just encountered is invalid for the RepeatingGroup
                        if (!groupSet.valid(tag))
                        {
                            // If it's not valid for the Message either, we consider it to be
                            // a custom tag
                            if (!tagSet.valid(tag) && tag != 10)
                            {
                                revertTag.ignore();
                                TRY_ADVANCE("Expected value after tag %d, got EOF", tag);

                                StreamCursor::Token valueToken(cursor);
                                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                                if (!strict)
                                {
                                    if (!skipUnknown)
                                        groupRef.unparsed.emplace_back(tag, valueToken.view());
                                    TRY_ADVANCE("Got early EOF after tag %d value", tag);
                                    continue;
                                }
                                else if (strict)
                                {
                                    context.setError(ErrorKind::UnknownTag, "Encountered unknown tag %d in RepeatingGroup %d", tag, GroupTag::Id);
                                    return;
                                }
                            }

                            inGroup = false;
                            break;
                        }

                        // The tag is already set in our GroupSet, we finished parsing the current instance
                        if (groupSet.test(tag))
                            break;

                        revertTag.ignore();

                        // Literal('=')
                        TRY_ADVANCE("Expected value after Tag %d, got EOF", tag);

                        groupSet.set(tag);

                        Visitor visitor(context, groupSet, strict, skipUnknown);

                        // Invariant: here visitField should ALWAYS return true as we are checking if the tag
                        // is valid prior to the call
                        //
                        // TODO: enfore the invariant ?
                        visitField(groupRef, tag, visitor);

                        // If we are in a recursive RepeatingGroup parsing, we must *NOT* advance the cursor
                        if (!visitor.recursive)
                            TRY_ADVANCE("Got early EOF in RepeatingGroup %d", GroupTag::Id);
                    }

                    field.add(std::move(groupRef));
                    groupSet.reset();

                } while (inGroup);

            }